

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string_sprintf.c
# Opt level: O0

void append_int(archive_string *as,intmax_t d,uint base)

{
  undefined4 in_EDX;
  archive_string *in_RSI;
  uintmax_t ud;
  undefined8 in_stack_ffffffffffffffd8;
  archive_string *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  archive_string *as_00;
  
  as_00 = in_RSI;
  if ((long)in_RSI < 0) {
    archive_strappend_char
              (in_stack_ffffffffffffffe0,(char)((ulong)in_stack_ffffffffffffffd8 >> 0x38));
    if (as_00 == (archive_string *)0x8000000000000000) {
      in_RSI = (archive_string *)0x8000000000000000;
    }
    else {
      in_RSI = (archive_string *)-(long)as_00;
    }
  }
  append_uint(as_00,CONCAT44(in_EDX,in_stack_ffffffffffffffe8),(uint)((ulong)in_RSI >> 0x20));
  return;
}

Assistant:

static void
append_int(struct archive_string *as, intmax_t d, unsigned base)
{
	uintmax_t ud;

	if (d < 0) {
		archive_strappend_char(as, '-');
		ud = (d == INTMAX_MIN) ? (uintmax_t)(INTMAX_MAX) + 1 : (uintmax_t)(-d);
	} else
		ud = d;
	append_uint(as, ud, base);
}